

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<TPZEqnArray<float>_> * __thiscall
TPZVec<TPZEqnArray<float>_>::operator=
          (TPZVec<TPZEqnArray<float>_> *this,TPZVec<TPZEqnArray<float>_> *copy)

{
  int64_t i;
  long lVar1;
  long lVar2;
  
  if (this != copy) {
    (*this->_vptr_TPZVec[3])(this,copy->fNElements);
    lVar2 = 0;
    for (lVar1 = 0; lVar1 < copy->fNElements; lVar1 = lVar1 + 1) {
      TPZEqnArray<float>::operator=
                ((TPZEqnArray<float> *)
                 ((long)(this->fStore->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                 lVar2 + -0x28),
                 (TPZEqnArray<float> *)
                 ((long)(copy->fStore->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                 lVar2 + -0x28));
      lVar2 = lVar2 + 0x22f0;
    }
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const TPZVec<T> &copy){
    if (this != &copy) {

      Resize(copy.NElements());

      for (int64_t i = 0; i < copy.fNElements; i++)
          fStore[i] = copy.fStore[i];
    }
    return *this;
}